

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

bool absl::lts_20250127::Cord::GetFlatAux
               (Nonnull<CordRep_*> rep,Nonnull<absl::string_view_*> fragment)

{
  byte bVar1;
  CordRep *this;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  CordRep *this_00;
  CordRepFlat *pCVar5;
  uint8_t *puVar6;
  CordRepExternal *pCVar7;
  CordRepBtree *pCVar8;
  CordRepSubstring *pCVar9;
  
  if (rep == (Nonnull<CordRep_*>)0x0) {
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                  ,0x57a,
                  "static bool absl::Cord::GetFlatAux(absl::Nonnull<CordRep *>, absl::Nonnull<absl::string_view *>)"
                 );
  }
  if (rep->length == 0) {
    fragment->_M_len = 0;
    fragment->_M_str = (char *)0x0;
  }
  else {
    this_00 = cord_internal::SkipCrcNode(rep);
    bVar1 = this_00->tag;
    if (bVar1 < 6) {
      if (bVar1 == 1) {
        pCVar9 = cord_internal::CordRep::substring(this_00);
        this = pCVar9->child;
        bVar1 = this->tag;
        if (bVar1 < 6) {
          if (bVar1 == 3) {
            pCVar8 = cord_internal::CordRep::btree(this);
            pCVar9 = cord_internal::CordRep::substring(this_00);
            bVar4 = cord_internal::CordRepBtree::IsFlat
                              (pCVar8,pCVar9->start,this_00->length,fragment);
            return bVar4;
          }
          if (bVar1 != 5) {
            return false;
          }
          pCVar7 = cord_internal::CordRep::external(this);
          pcVar2 = pCVar7->base;
          pCVar9 = cord_internal::CordRep::substring(this_00);
          sVar3 = pCVar9->start;
          fragment->_M_len = this_00->length;
          fragment->_M_str = pcVar2 + sVar3;
          return true;
        }
        pCVar5 = cord_internal::CordRep::flat(this);
        pCVar9 = cord_internal::CordRep::substring(this_00);
        puVar6 = (pCVar5->super_CordRep).storage + pCVar9->start;
      }
      else {
        if (bVar1 == 3) {
          pCVar8 = cord_internal::CordRep::btree(this_00);
          bVar4 = cord_internal::CordRepBtree::IsFlat(pCVar8,fragment);
          return bVar4;
        }
        if (bVar1 != 5) {
          return false;
        }
        pCVar7 = cord_internal::CordRep::external(this_00);
        puVar6 = (uint8_t *)pCVar7->base;
      }
    }
    else {
      pCVar5 = cord_internal::CordRep::flat(this_00);
      puVar6 = (pCVar5->super_CordRep).storage;
    }
    fragment->_M_len = this_00->length;
    fragment->_M_str = (char *)puVar6;
  }
  return true;
}

Assistant:

bool Cord::GetFlatAux(absl::Nonnull<CordRep*> rep,
                                   absl::Nonnull<absl::string_view*> fragment) {
  assert(rep != nullptr);
  if (rep->length == 0) {
    *fragment = absl::string_view();
    return true;
  }
  rep = cord_internal::SkipCrcNode(rep);
  if (rep->IsFlat()) {
    *fragment = absl::string_view(rep->flat()->Data(), rep->length);
    return true;
  } else if (rep->IsExternal()) {
    *fragment = absl::string_view(rep->external()->base, rep->length);
    return true;
  } else if (rep->IsBtree()) {
    return rep->btree()->IsFlat(fragment);
  } else if (rep->IsSubstring()) {
    CordRep* child = rep->substring()->child;
    if (child->IsFlat()) {
      *fragment = absl::string_view(
          child->flat()->Data() + rep->substring()->start, rep->length);
      return true;
    } else if (child->IsExternal()) {
      *fragment = absl::string_view(
          child->external()->base + rep->substring()->start, rep->length);
      return true;
    } else if (child->IsBtree()) {
      return child->btree()->IsFlat(rep->substring()->start, rep->length,
                                    fragment);
    }
  }
  return false;
}